

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::Texture2D::Texture2D(Texture2D *this,TextureFormat *format,int width,int height)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = height;
  if (height < width) {
    uVar3 = width;
  }
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,0x20 - uVar2);
  this->m_width = width;
  this->m_height = height;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)(((long)(this->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28);
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

Texture2D::Texture2D (const TextureFormat& format, int width, int height)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width, height))
	, m_width				(width)
	, m_height				(height)
	, m_view				(getNumLevels(), getLevels())
{
}